

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  uint uVar1;
  pointer ppCVar2;
  CFGNode *pCVar3;
  pointer puVar4;
  bool bVar5;
  pointer ppCVar6;
  uint32_t *src_reachability;
  uint uVar7;
  byte bVar8;
  CFGNode *other;
  
  if (node != merge) {
    bVar5 = control_flow_is_escaping_from_loop(this,node,merge);
    if (bVar5) {
      return true;
    }
    bVar5 = block_is_load_bearing(this,node,merge);
    if (!bVar5) {
      ppCVar6 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar6 != ppCVar2) {
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (((*ppCVar6)->ir).terminator.type == Switch);
          ppCVar6 = ppCVar6 + 1;
        } while (ppCVar6 != ppCVar2);
        if (1 < uVar7) {
          return true;
        }
      }
      bVar5 = CFGNode::reaches_domination_frontier_before_merge(node,merge);
      if (!bVar5) {
        ppCVar2 = (node->post_dominance_frontier).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar6 = (node->post_dominance_frontier).
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppCVar6 != ppCVar2;
            ppCVar6 = ppCVar6 + 1) {
          pCVar3 = *ppCVar6;
          bVar5 = CFGNode::dominates(pCVar3,node);
          if ((bVar5) &&
             (bVar5 = CFGNode::reaches_domination_frontier_before_merge(pCVar3,merge), bVar5)) {
            return true;
          }
        }
        ppCVar6 = (node->succ).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((long)(node->succ).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 == 8) &&
           ((*ppCVar6)->succ_back_edge != (CFGNode *)0x0)) {
          return true;
        }
        if (((node->ir).operations.
             super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (node->ir).operations.
             super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (((node->ir).phi.
             super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             (node->ir).phi.
             super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
             _M_impl.super__Vector_impl_data._M_finish &&
            (bVar5 = CFGNode::post_dominates_any_work(node), !bVar5)))) {
          return true;
        }
        if ((ulong)((long)(node->pred).
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(node->pred).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 9) {
          return true;
        }
        ppCVar6 = (merge->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar2 = (merge->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar6 == ppCVar2) {
          return true;
        }
        pCVar3 = node->immediate_dominator;
        bVar8 = 0;
        do {
          other = *ppCVar6;
          bVar5 = CFGNode::dominates(pCVar3,other);
          if ((other != node) && (bVar5)) {
            puVar4 = (this->reachability_bitset).
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = node->forward_post_visit_order;
            do {
              uVar1 = other->forward_post_visit_order;
              if ((puVar4[(ulong)(uVar7 >> 5) + (ulong)(this->reachability_stride * uVar1)] &
                  1 << ((byte)uVar7 & 0x1f)) != 0) {
                bVar8 = 1;
                break;
              }
              if ((puVar4[(ulong)(uVar7 * this->reachability_stride) + (ulong)(uVar1 >> 5)] >>
                   (uVar1 & 0x1f) & 1) != 0) {
                return true;
              }
              other = other->immediate_dominator;
            } while (other != node);
          }
          ppCVar6 = ppCVar6 + 1;
          if (ppCVar6 == ppCVar2) {
            return (bool)(bVar8 ^ 1);
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping(const CFGNode *node, const CFGNode *merge) const
{
	if (node == merge)
		return false;

	if (control_flow_is_escaping_from_loop(node, merge))
		return true;

	// Try to test if our block is load bearing, in which case it cannot be considered a break block.
	// If the only path from idom to merge goes through node, it must be considered load bearing,
	// since removing break paths must not change reachability.
	if (block_is_load_bearing(node, merge))
		return false;

	// If we have two different switch blocks in our PDF frontier something ridiculous is happening
	// where we effectively have one switch block falling through to another switch block (?!?!?!)
	// Definitely needs to be split up.
	unsigned switch_pdf_frontiers = 0;
	for (auto *frontier : node->post_dominance_frontier)
		if (frontier->ir.terminator.type == Terminator::Type::Switch)
			switch_pdf_frontiers++;

	if (switch_pdf_frontiers >= 2)
		return true;

	// If we cannot prove the escape through loop analysis, we might be able to deduce it from domination frontiers.
	// If control flow is not escaping, then there must exist a dominance frontier node A,
	// where merge strictly post-dominates A.
	// This means that control flow can merge somewhere before we hit the merge block, and we consider that
	// normal structured control flow.

	bool escaping_path = !node->reaches_domination_frontier_before_merge(merge);

	// This is a strong check.
	// If node directly branches to merge, but PDF does not,
	// we have detected a control flow pattern which is clearly a break.
	// The PDF candidate must dominate node for this check to be meaningful.
	if (escaping_path)
	{
		for (auto *frontier : node->post_dominance_frontier)
			if (frontier->dominates(node) && frontier->reaches_domination_frontier_before_merge(merge))
				return true;

		// Strong check as well.
		// If branching directly to continue block like this, this is a non-merging continue,
		// which we should always consider an escape.
		if (node->succ.size() == 1 && node->succ.front()->succ_back_edge)
			return true;
	}

	if (escaping_path && node->ir.operations.empty() && node->ir.phi.empty())
	{
		// If we post-dominate nothing useful or do nothing useful ourselves,
		// this is a good indication we're a common escape edge ladder block.
		// This can happen if we have a graph of:
		// A -> B
		// A -> C
		// B -> merge
		// C -> merge
		// B -> node
		// C -> node
		// node -> merge
		// This super jank diamond pattern will break the heuristics.
		if (!node->post_dominates_any_work())
			return true;
	}

	if (escaping_path && node->pred.size() >= 2)
	{
		// We also need to consider false positives here, which are mostly only relevant for merge candidates.

		// One case would be selection construct A, which terminates in block B. B then branches to C.
		// Earlier in the A -> B construct, there might be a break block D which also branches to B.
		// This means that C will be a "false" domination frontier of B and our analysis above is wrong.

		// The algorithm here:
		// - Get idom of node, which represents the header. For this analysis, we're only interested
		//   in code paths which are dominated by idom.
		// - Find all preds of merge which are dominated by idom(node).
		// - Backtrace every pred P until they can reach B, or B can reach P.
		// - If B has strictly lowest post-visit order, we are not escaping. P was.

		auto *idom = node->immediate_dominator;
		bool found_false_positive = false;

		for (auto *pred : merge->pred)
		{
			// Don't care about these.
			if (!idom->dominates(pred))
				continue;

			while (pred != node && !query_reachability(*pred, *node) && !query_reachability(*node, *pred))
				pred = pred->immediate_dominator;

			// Ignore these.
			if (pred == node)
				continue;

			if (query_reachability(*pred, *node))
			{
				// Seems good. Keep going. If we don't find a counter example, we'll accept this as a false positive.
				found_false_positive = true;
			}
			else
			{
				// Indeed, this is an escape.
				found_false_positive = false;
				break;
			}
		}

		escaping_path = !found_false_positive;
	}

	return escaping_path;
}